

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

Expression * __thiscall
CFG::MultipleShape::Render(MultipleShape *this,RelooperBuilder *Builder,bool InLoop)

{
  pointer ppIVar1;
  Shape *pSVar2;
  int iVar3;
  Binary *condition;
  Expression *ifTrue;
  _Base_ptr p_Var4;
  Block *pBVar5;
  undefined4 extraout_var;
  If *this_00;
  undefined1 auStack_68 [8];
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> finalizeStack;
  If *local_48;
  If *local_40;
  If *Now;
  
  finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p_Var4 = (this->InnerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = (If *)0x0;
  Now._4_4_ = (uint)InLoop;
  local_48 = (If *)0x0;
  for (; (_Rb_tree_header *)p_Var4 != &(this->InnerMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    condition = RelooperBuilder::makeCheckLabel(Builder,p_Var4[1]._M_color);
    ifTrue = (Expression *)
             (**(code **)(*(long *)p_Var4[1]._M_parent + 0x10))
                       (p_Var4[1]._M_parent,Builder,Now._4_4_);
    local_40 = ::wasm::Builder::makeIf
                         (&Builder->super_Builder,(Expression *)condition,ifTrue,(Expression *)0x0);
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
              ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)auStack_68,&local_40);
    if (this_00 == (If *)0x0) {
      local_48 = local_40;
    }
    else {
      this_00->ifFalse = (Expression *)local_40;
      ::wasm::If::finalize(this_00);
    }
    this_00 = local_40;
  }
  while ((undefined1  [8])
         finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_start != auStack_68) {
    ppIVar1 = finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
              super__Vector_impl_data._M_start + -1;
    finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    ::wasm::If::finalize(*ppIVar1);
  }
  pBVar5 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)local_48);
  pBVar5 = (Block *)HandleFollowupMultiples
                              ((Expression *)pBVar5,&this->super_Shape,Builder,SUB41(Now._4_4_,0));
  pSVar2 = (this->super_Shape).Next;
  if (pSVar2 != (Shape *)0x0) {
    iVar3 = (*pSVar2->_vptr_Shape[2])(pSVar2,Builder,(ulong)Now._4_4_);
    pBVar5 = ::wasm::Builder::makeSequence
                       (&Builder->super_Builder,(Expression *)pBVar5,
                        (Expression *)CONCAT44(extraout_var,iVar3));
  }
  std::_Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>::~_Vector_base
            ((_Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_> *)auStack_68);
  return (Expression *)pBVar5;
}

Assistant:

wasm::Expression* MultipleShape::Render(RelooperBuilder& Builder, bool InLoop) {
  // TODO: consider switch
  // emit an if-else chain
  wasm::If* FirstIf = nullptr;
  wasm::If* CurrIf = nullptr;
  std::vector<wasm::If*> finalizeStack;
  for (auto& [Id, Body] : InnerMap) {
    auto* Now =
      Builder.makeIf(Builder.makeCheckLabel(Id), Body->Render(Builder, InLoop));
    finalizeStack.push_back(Now);
    if (!CurrIf) {
      FirstIf = CurrIf = Now;
    } else {
      CurrIf->ifFalse = Now;
      CurrIf->finalize();
      CurrIf = Now;
    }
  }
  while (finalizeStack.size() > 0) {
    wasm::If* curr = finalizeStack.back();
    finalizeStack.pop_back();
    curr->finalize();
  }
  wasm::Expression* Ret = Builder.makeBlock(FirstIf);
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}